

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::mat_to_quat(Epnp *this,double (*R) [3],double *q)

{
  double *in_RDX;
  double *in_RSI;
  double dVar1;
  double scale;
  double n4;
  double tr;
  double local_28;
  
  dVar1 = *in_RSI + in_RSI[4] + in_RSI[8];
  if (dVar1 <= 0.0) {
    if ((*in_RSI <= in_RSI[4]) || (*in_RSI <= in_RSI[8])) {
      if (in_RSI[4] <= in_RSI[8]) {
        *in_RDX = in_RSI[6] + in_RSI[2];
        in_RDX[1] = in_RSI[7] + in_RSI[5];
        in_RDX[2] = ((in_RSI[8] + 1.0) - *in_RSI) - in_RSI[4];
        in_RDX[3] = in_RSI[1] - in_RSI[3];
        local_28 = in_RDX[2];
      }
      else {
        *in_RDX = in_RSI[3] + in_RSI[1];
        in_RDX[1] = ((in_RSI[4] + 1.0) - *in_RSI) - in_RSI[8];
        in_RDX[2] = in_RSI[7] + in_RSI[5];
        in_RDX[3] = in_RSI[6] - in_RSI[2];
        local_28 = in_RDX[1];
      }
    }
    else {
      *in_RDX = ((*in_RSI + 1.0) - in_RSI[4]) - in_RSI[8];
      in_RDX[1] = in_RSI[3] + in_RSI[1];
      in_RDX[2] = in_RSI[6] + in_RSI[2];
      in_RDX[3] = in_RSI[5] - in_RSI[7];
      local_28 = *in_RDX;
    }
  }
  else {
    *in_RDX = in_RSI[5] - in_RSI[7];
    in_RDX[1] = in_RSI[6] - in_RSI[2];
    in_RDX[2] = in_RSI[1] - in_RSI[3];
    in_RDX[3] = dVar1 + 1.0;
    local_28 = in_RDX[3];
  }
  dVar1 = sqrt(local_28);
  dVar1 = 0.5 / dVar1;
  *in_RDX = dVar1 * *in_RDX;
  in_RDX[1] = dVar1 * in_RDX[1];
  in_RDX[2] = dVar1 * in_RDX[2];
  in_RDX[3] = dVar1 * in_RDX[3];
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::mat_to_quat(
    const double R[3][3],
    double q[4])
{
  double tr = R[0][0] + R[1][1] + R[2][2];
  double n4;

  if (tr > 0.0f)
  {
    q[0] = R[1][2] - R[2][1];
    q[1] = R[2][0] - R[0][2];
    q[2] = R[0][1] - R[1][0];
    q[3] = tr + 1.0f;
    n4 = q[3];
  }
  else if ( (R[0][0] > R[1][1]) && (R[0][0] > R[2][2]) )
  {
    q[0] = 1.0f + R[0][0] - R[1][1] - R[2][2];
    q[1] = R[1][0] + R[0][1];
    q[2] = R[2][0] + R[0][2];
    q[3] = R[1][2] - R[2][1];
    n4 = q[0];
  }
  else if (R[1][1] > R[2][2])
  {
    q[0] = R[1][0] + R[0][1];
    q[1] = 1.0f + R[1][1] - R[0][0] - R[2][2];
    q[2] = R[2][1] + R[1][2];
    q[3] = R[2][0] - R[0][2];
    n4 = q[1];
  }
  else
  {
    q[0] = R[2][0] + R[0][2];
    q[1] = R[2][1] + R[1][2];
    q[2] = 1.0f + R[2][2] - R[0][0] - R[1][1];
    q[3] = R[0][1] - R[1][0];
    n4 = q[2];
  }
  double scale = 0.5f / double(sqrt(n4));

  q[0] *= scale;
  q[1] *= scale;
  q[2] *= scale;
  q[3] *= scale;
}